

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TtfUtil.cpp
# Opt level: O0

bool TtfUtil::GetComponentGlyphIds
               (void *pSimpleGlyf,int *prgnCompId,size_t cnCompIdTotal,size_t *cnCompId)

{
  uint16 uVar1;
  uint16 uVar2;
  int iVar3;
  ulong *in_RCX;
  ulong in_RDX;
  long in_RSI;
  ulong uVar4;
  int nOffset;
  size_t iCurrentComp;
  uint16 GlyphFlags;
  uint8 *pbGlyph;
  SimpleGlyph *pGlyph;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  ulong local_48;
  bool local_1;
  
  iVar3 = GlyfContourCount((void *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  if (iVar3 < 0) {
    local_48 = 0;
    do {
      uVar1 = read<unsigned_short>(0);
      uVar2 = read<unsigned_short>(0);
      uVar4 = local_48 + 1;
      *(uint *)(in_RSI + local_48 * 4) = (uint)uVar2;
      if (in_RDX <= uVar4) {
        return false;
      }
      local_48 = uVar4;
    } while ((uVar1 & 0x20) != 0);
    *in_RCX = uVar4;
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool GetComponentGlyphIds(const void * pSimpleGlyf, int * prgnCompId, 
		size_t cnCompIdTotal, size_t & cnCompId)
{
	using namespace Sfnt;
	
	if (GlyfContourCount(pSimpleGlyf) >= 0)
		return false;

	const Sfnt::SimpleGlyph * pGlyph = reinterpret_cast<const Sfnt::SimpleGlyph *>(pSimpleGlyf);
	// for a composite glyph, the special data begins here
	const uint8 * pbGlyph = reinterpret_cast<const uint8 *>(&pGlyph->end_pts_of_contours[0]);

	uint16 GlyphFlags;
	size_t iCurrentComp = 0;
	do 
	{
		GlyphFlags = read(*((uint16 *)pbGlyph));
		pbGlyph += sizeof(uint16);
		prgnCompId[iCurrentComp++] = read(*((uint16 *)pbGlyph));
		pbGlyph += sizeof(uint16);
		if (iCurrentComp >= cnCompIdTotal) 
			return false;
		int nOffset = 0;
		nOffset += GlyphFlags & CompoundGlyph::Arg1Arg2Words ? 4 : 2;
		nOffset += GlyphFlags & CompoundGlyph::HaveScale ? 2 : 0;
		nOffset += GlyphFlags & CompoundGlyph::HaveXAndYScale  ? 4 : 0;
		nOffset += GlyphFlags & CompoundGlyph::HaveTwoByTwo  ? 8 :  0;
		pbGlyph += nOffset;
	} while (GlyphFlags & CompoundGlyph::MoreComponents);

	cnCompId = iCurrentComp;

	return true;
}